

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O0

char * ssh2_fingerprint_blob(ptrlen blob,FingerprintType fptype)

{
  uint uVar1;
  uint uVar2;
  strbuf *sb_00;
  ssh_keyalg *self;
  char *pcVar3;
  ptrlen name;
  int bits;
  ssh_keyalg *alg;
  ptrlen algname;
  BinarySource src [1];
  strbuf *sb;
  FingerprintType fptype_local;
  ptrlen blob_local;
  
  sb_00 = strbuf_new();
  BinarySource_INIT__((BinarySource *)&algname.len,blob);
  name = BinarySource_get_string((BinarySource *)src[0]._24_8_);
  if (*(int *)(src[0]._24_8_ + 0x18) == 0) {
    self = find_pubkey_alg_len(name);
    algname.ptr = (void *)name.len;
    alg = (ssh_keyalg *)name.ptr;
    if (self == (ssh_keyalg *)0x0) {
      uVar1 = string_length_for_printf((size_t)algname.ptr);
      BinarySink_put_fmt(sb_00->binarysink_,"%.*s ",(ulong)uVar1,alg);
    }
    else {
      uVar1 = ssh_key_public_bits(self,blob);
      uVar2 = string_length_for_printf((size_t)algname.ptr);
      BinarySink_put_fmt(sb_00->binarysink_,"%.*s %d ",(ulong)uVar2,alg,(ulong)uVar1);
    }
  }
  if (fptype == SSH_FPTYPE_MD5) {
    ssh2_fingerprint_blob_md5(blob,sb_00);
  }
  else if (fptype == SSH_FPTYPE_SHA256) {
    ssh2_fingerprint_blob_sha256(blob,sb_00);
  }
  pcVar3 = strbuf_to_str(sb_00);
  return pcVar3;
}

Assistant:

char *ssh2_fingerprint_blob(ptrlen blob, FingerprintType fptype)
{
    strbuf *sb = strbuf_new();

    /*
     * Identify the key algorithm, if possible.
     *
     * If we can't do that, then we have a seriously confused key
     * blob, in which case we return only the hash.
     */
    BinarySource src[1];
    BinarySource_BARE_INIT_PL(src, blob);
    ptrlen algname = get_string(src);
    if (!get_err(src)) {
        const ssh_keyalg *alg = find_pubkey_alg_len(algname);
        if (alg) {
            int bits = ssh_key_public_bits(alg, blob);
            put_fmt(sb, "%.*s %d ", PTRLEN_PRINTF(algname), bits);
        } else {
            put_fmt(sb, "%.*s ", PTRLEN_PRINTF(algname));
        }
    }

    switch (fptype) {
      case SSH_FPTYPE_MD5:
        ssh2_fingerprint_blob_md5(blob, sb);
        break;
      case SSH_FPTYPE_SHA256:
        ssh2_fingerprint_blob_sha256(blob, sb);
        break;
    }

    return strbuf_to_str(sb);
}